

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int pk_parse_key_pkcs1_der(mbedtls_rsa_context *rsa,uchar *key,size_t keylen)

{
  int iVar1;
  uint uVar2;
  uchar *end;
  uchar *p;
  mbedtls_mpi T;
  int version;
  size_t len;
  uchar *local_50;
  mbedtls_mpi local_48;
  int local_2c;
  size_t local_28;
  
  mbedtls_mpi_init(&local_48);
  local_50 = key;
  iVar1 = mbedtls_asn1_get_tag(&local_50,key + keylen,&local_28,0x30);
  if (iVar1 == 0) {
    end = local_50 + local_28;
    iVar1 = mbedtls_asn1_get_int(&local_50,end,&local_2c);
    if (iVar1 == 0) {
      if (local_2c != 0) {
        return -0x3d80;
      }
      uVar2 = asn1_get_nonzero_mpi(&local_50,end,&local_48);
      if (((((((uVar2 == 0) &&
              (uVar2 = mbedtls_rsa_import(rsa,&local_48,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                          (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0), uVar2 == 0)) &&
             (uVar2 = asn1_get_nonzero_mpi(&local_50,end,&local_48), uVar2 == 0)) &&
            ((uVar2 = mbedtls_rsa_import(rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                         (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&local_48),
             uVar2 == 0 && (uVar2 = asn1_get_nonzero_mpi(&local_50,end,&local_48), uVar2 == 0)))) &&
           ((uVar2 = mbedtls_rsa_import(rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0
                                        ,&local_48,(mbedtls_mpi *)0x0), uVar2 == 0 &&
            ((uVar2 = asn1_get_nonzero_mpi(&local_50,end,&local_48), uVar2 == 0 &&
             (uVar2 = mbedtls_rsa_import(rsa,(mbedtls_mpi *)0x0,&local_48,(mbedtls_mpi *)0x0,
                                         (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0), uVar2 == 0)))))) &&
          (uVar2 = asn1_get_nonzero_mpi(&local_50,end,&local_48), uVar2 == 0)) &&
         (((((uVar2 = mbedtls_rsa_import(rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&local_48,
                                         (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0), uVar2 == 0 &&
             (uVar2 = asn1_get_nonzero_mpi(&local_50,end,&local_48), uVar2 == 0)) &&
            (uVar2 = mbedtls_mpi_copy(&rsa->DP,&local_48), uVar2 == 0)) &&
           (((uVar2 = asn1_get_nonzero_mpi(&local_50,end,&local_48), uVar2 == 0 &&
             (uVar2 = mbedtls_mpi_copy(&rsa->DQ,&local_48), uVar2 == 0)) &&
            ((uVar2 = asn1_get_nonzero_mpi(&local_50,end,&local_48), uVar2 == 0 &&
             ((uVar2 = mbedtls_mpi_copy(&rsa->QP,&local_48), uVar2 == 0 &&
              (uVar2 = mbedtls_rsa_complete(rsa), uVar2 == 0)))))))) &&
          (uVar2 = mbedtls_rsa_check_pubkey(rsa), uVar2 == 0)))) {
        uVar2 = 0xffffc29a;
        if (local_50 == end) {
          uVar2 = 0;
        }
      }
      mbedtls_mpi_free(&local_48);
      if (uVar2 != 0) {
        iVar1 = uVar2 - 0x3d00;
        if ((uVar2 & 0xff80) != 0) {
          iVar1 = -0x3d00;
        }
        mbedtls_rsa_free(rsa);
        return iVar1;
      }
      return 0;
    }
  }
  return iVar1 + -0x3d00;
}

Assistant:

static int pk_parse_key_pkcs1_der( mbedtls_rsa_context *rsa,
                                   const unsigned char *key,
                                   size_t keylen )
{
    int ret, version;
    size_t len;
    unsigned char *p, *end;

    mbedtls_mpi T;
    mbedtls_mpi_init( &T );

    p = (unsigned char *) key;
    end = p + keylen;

    /*
     * This function parses the RSAPrivateKey (PKCS#1)
     *
     *  RSAPrivateKey ::= SEQUENCE {
     *      version           Version,
     *      modulus           INTEGER,  -- n
     *      publicExponent    INTEGER,  -- e
     *      privateExponent   INTEGER,  -- d
     *      prime1            INTEGER,  -- p
     *      prime2            INTEGER,  -- q
     *      exponent1         INTEGER,  -- d mod (p-1)
     *      exponent2         INTEGER,  -- d mod (q-1)
     *      coefficient       INTEGER,  -- (inverse of q) mod p
     *      otherPrimeInfos   OtherPrimeInfos OPTIONAL
     *  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_int( &p, end, &version ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    if( version != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_VERSION );
    }

    /* Import N */
    if( ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 ||
        ( ret = mbedtls_rsa_import( rsa, &T, NULL, NULL,
                                        NULL, NULL ) ) != 0 )
        goto cleanup;

    /* Import E */
    if( ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 ||
        ( ret = mbedtls_rsa_import( rsa, NULL, NULL, NULL,
                                        NULL, &T ) ) != 0 )
        goto cleanup;

    /* Import D */
    if( ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 ||
        ( ret = mbedtls_rsa_import( rsa, NULL, NULL, NULL,
                                        &T, NULL ) ) != 0 )
        goto cleanup;

    /* Import P */
    if( ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 ||
        ( ret = mbedtls_rsa_import( rsa, NULL, &T, NULL,
                                        NULL, NULL ) ) != 0 )
        goto cleanup;

    /* Import Q */
    if( ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 ||
        ( ret = mbedtls_rsa_import( rsa, NULL, NULL, &T,
                                        NULL, NULL ) ) != 0 )
        goto cleanup;

#if !defined(MBEDTLS_RSA_NO_CRT) && !defined(MBEDTLS_RSA_ALT)
    /*
    * The RSA CRT parameters DP, DQ and QP are nominally redundant, in
    * that they can be easily recomputed from D, P and Q. However by
    * parsing them from the PKCS1 structure it is possible to avoid
    * recalculating them which both reduces the overhead of loading
    * RSA private keys into memory and also avoids side channels which
    * can arise when computing those values, since all of D, P, and Q
    * are secret. See https://eprint.iacr.org/2020/055 for a
    * description of one such attack.
    */

    /* Import DP */
    if( ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &rsa->DP, &T ) ) != 0 )
       goto cleanup;

    /* Import DQ */
    if( ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &rsa->DQ, &T ) ) != 0 )
       goto cleanup;

    /* Import QP */
    if( ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &rsa->QP, &T ) ) != 0 )
       goto cleanup;

#else
    /* Verify existance of the CRT params */
    if( ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 ||
        ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 ||
        ( ret = asn1_get_nonzero_mpi( &p, end, &T ) ) != 0 )
       goto cleanup;
#endif

    /* rsa_complete() doesn't complete anything with the default
     * implementation but is still called:
     * - for the benefit of alternative implementation that may want to
     *   pre-compute stuff beyond what's provided (eg Montgomery factors)
     * - as is also sanity-checks the key
     *
     * Furthermore, we also check the public part for consistency with
     * mbedtls_pk_parse_pubkey(), as it includes size minima for example.
     */
    if( ( ret = mbedtls_rsa_complete( rsa ) ) != 0 ||
        ( ret = mbedtls_rsa_check_pubkey( rsa ) ) != 0 )
    {
        goto cleanup;
    }

    if( p != end )
    {
        ret = MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
              MBEDTLS_ERR_ASN1_LENGTH_MISMATCH ;
    }

cleanup:

    mbedtls_mpi_free( &T );

    if( ret != 0 )
    {
        /* Wrap error code if it's coming from a lower level */
        if( ( ret & 0xff80 ) == 0 )
            ret = MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret;
        else
            ret = MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;

        mbedtls_rsa_free( rsa );
    }

    return( ret );
}